

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

void duckdb_je_background_thread_postfork_child(tsdn_t *tsdn)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  bool bVar3;
  background_thread_info_t *pbVar4;
  int iVar5;
  ulong uVar6;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  ulong uVar7;
  
  if (duckdb_je_max_background_threads != 0) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      duckdb_je_malloc_mutex_postfork_child(tsdn,&duckdb_je_background_thread_info[uVar6].mtx);
      bVar3 = uVar7 < duckdb_je_max_background_threads;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  duckdb_je_malloc_mutex_postfork_child(tsdn,&duckdb_je_background_thread_lock);
  if (background_thread_enabled_at_fork != false) {
    iVar5 = pthread_mutex_trylock
                      ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
    if (iVar5 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
      duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
    }
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
         duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
    if (duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
      duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
           (witness_t *)
           (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
    }
    duckdb_je_n_background_threads = 0;
    duckdb_je_background_thread_enabled_state.repr = false;
    if (duckdb_je_max_background_threads != 0) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        pbVar4 = duckdb_je_background_thread_info;
        __mutex = (pthread_mutex_t *)
                  ((long)&duckdb_je_background_thread_info[uVar6].mtx.field_0 + 0x48);
        iVar5 = pthread_mutex_trylock(__mutex);
        if (iVar5 != 0) {
          duckdb_je_malloc_mutex_lock_slow(&pbVar4[uVar6].mtx);
          pbVar4[uVar6].mtx.field_0.field_0.locked.repr = true;
        }
        puVar1 = &pbVar4[uVar6].mtx.field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (pbVar4[uVar6].mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
          pbVar4[uVar6].mtx.field_0.field_0.prof_data.prev_owner = tsdn;
          ppwVar2 = &pbVar4[uVar6].mtx.field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        pbVar4[uVar6].state = background_thread_stopped;
        pthread_cond_init((pthread_cond_t *)&pbVar4[uVar6].cond,(pthread_condattr_t *)0x0);
        pbVar4[uVar6].indefinite_sleep.repr = false;
        duckdb_je_nstime_init(&pbVar4[uVar6].next_wakeup,0);
        pbVar4[uVar6].npages_to_purge_new = 0;
        pbVar4[uVar6].tot_n_runs = 0;
        duckdb_je_nstime_copy(&pbVar4[uVar6].tot_sleep_time,&nstime_zero);
        pbVar4[uVar6].mtx.field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        bVar3 = uVar7 < duckdb_je_max_background_threads;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock
              ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
    return;
  }
  return;
}

Assistant:

void
background_thread_postfork_child(tsdn_t *tsdn) {
	for (unsigned i = 0; i < max_background_threads; i++) {
		malloc_mutex_postfork_child(tsdn,
		    &background_thread_info[i].mtx);
	}
	malloc_mutex_postfork_child(tsdn, &background_thread_lock);
	if (!background_thread_enabled_at_fork) {
		return;
	}

	/* Clear background_thread state (reset to disabled for child). */
	malloc_mutex_lock(tsdn, &background_thread_lock);
	n_background_threads = 0;
	background_thread_enabled_set(tsdn, false);
	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		int ret = pthread_cond_init(&info->cond, NULL);
		assert(ret == 0);
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
	malloc_mutex_unlock(tsdn, &background_thread_lock);
}